

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOptions.cpp
# Opt level: O0

Image * __thiscall nvtt::InputOptions::Private::image(Private *this,uint face,uint mipmap)

{
  Image *pIVar1;
  InputImage *image;
  uint mipmap_local;
  uint face_local;
  Private *this_local;
  
  pIVar1 = nv::AutoPtr<nv::Image>::ptr(&this->images[face * this->mipmapCount + mipmap].data);
  return pIVar1;
}

Assistant:

const Image * InputOptions::Private::image(uint face, uint mipmap) const
{
	nvDebugCheck(face < faceCount);
	nvDebugCheck(mipmap < mipmapCount);

	const InputImage & image = this->images[face * mipmapCount + mipmap];
	nvDebugCheck(image.face == face);
	nvDebugCheck(image.mipLevel == mipmap);

	return image.data.ptr();
}